

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSpline.cpp
# Opt level: O2

void __thiscall
IGACpp::BSpline::setKnotVectors(BSpline *this,vector<double,_std::allocator<double>_> *knotVector)

{
  double dVar1;
  reference pvVar2;
  runtime_error *this_00;
  ulong __n;
  
  __n = 0;
  do {
    if (((long)(knotVector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(knotVector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3) - 1U <= __n) {
      std::vector<double,_std::allocator<double>_>::operator=(&this->_knotVector,knotVector);
      return;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::at(knotVector,__n);
    dVar1 = *pvVar2;
    __n = __n + 1;
    pvVar2 = std::vector<double,_std::allocator<double>_>::at(knotVector,__n);
  } while (dVar1 < *pvVar2 || dVar1 == *pvVar2);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"BSpline::setKnotVectors: knot vector must be in increasing order.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BSpline::setKnotVectors(std::vector<double> knotVector)
    {
        // check if the given knot vector is non-decreasing
        for (size_t i{}; i < (knotVector.size() - 1); ++i)
        {
            if (knotVector.at(i) > knotVector.at(i + 1))
            {
                throw std::runtime_error("BSpline::setKnotVectors: knot vector must be in increasing order.");
            }
        }

        // set knotvector
        _knotVector = knotVector;
    }